

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O0

void fmt_PrintNumber(char *buf,size_t bufLen,FormatSpec *fmt,uint32_t value)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  undefined1 *puVar4;
  double dVar5;
  ulong local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1c8;
  char local_1b4;
  ulong local_1b0;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t pos;
  size_t padLen;
  size_t totalLen;
  size_t numLen;
  size_t len;
  char *spec;
  size_t fracWidth;
  ulong uStack_158;
  char c;
  size_t j;
  size_t i;
  size_t valueLen;
  char *ptr;
  char valueBuf [262];
  char prefix;
  int32_t v;
  char sign;
  uint32_t value_local;
  FormatSpec *fmt_local;
  size_t bufLen_local;
  char *buf_local;
  
  if ((((fmt->type != 0x58) && (fmt->type != 0x78)) && (fmt->type != 0x62)) &&
     ((fmt->type != 0x6f && ((fmt->prefix & 1U) != 0)))) {
    error("Formatting type \'%c\' with prefix flag \'#\'\n",(ulong)(uint)fmt->type);
  }
  if ((fmt->type != 0x66) && ((fmt->hasFrac & 1U) != 0)) {
    error("Formatting type \'%c\' with fractional width\n",(ulong)(uint)fmt->type);
  }
  if (fmt->type == 0x73) {
    error("Formatting number as type \'s\'\n");
  }
  prefix = (char)fmt->sign;
  v = value;
  if ((((fmt->type == 100) || (fmt->type == 0x66)) &&
      (stack0xffffffffffffffd4 = value, (int)value < 0)) && (value != 0x80000000)) {
    prefix = '-';
    v = -value;
  }
  if ((fmt->prefix & 1U) == 0) {
    local_1b4 = '\0';
  }
  else if (fmt->type == 0x58) {
    local_1b4 = '$';
  }
  else if (fmt->type == 0x78) {
    local_1b4 = '$';
  }
  else if (fmt->type == 0x62) {
    local_1b4 = '%';
  }
  else {
    local_1b4 = '\0';
    if (fmt->type == 0x6f) {
      local_1b4 = '&';
    }
  }
  valueBuf[0x103] = local_1b4;
  if (fmt->type == 0x62) {
    valueLen = (size_t)&ptr;
    do {
      puVar4 = (undefined1 *)(valueLen + 1);
      *(byte *)valueLen = ((byte)v & 1) + 0x30;
      v = (uint)v >> 1;
      valueLen = (size_t)puVar4;
    } while (v != 0);
    *puVar4 = 0;
    uVar3 = (long)puVar4 - (long)&ptr;
    for (j = 0; uStack_158 = uVar3 - 1, j < uStack_158; j = j + 1) {
      cVar1 = valueBuf[j - 8];
      valueBuf[j - 8] = *(char *)((long)&valueLen + uVar3 + 7);
      *(char *)((long)&valueLen + uVar3 + 7) = cVar1;
      uVar3 = uStack_158;
    }
  }
  else if (fmt->type == 0x66) {
    if ((fmt->hasFrac & 1U) == 0) {
      local_1c8 = (char *)0x5;
    }
    else {
      local_1c8 = (char *)fmt->fracWidth;
    }
    spec = local_1c8;
    if ((char *)0xff < local_1c8) {
      error("Fractional width %zu too long, limiting to 255\n",local_1c8);
      spec = (char *)0xff;
    }
    dVar5 = fix_PrecisionFactor();
    snprintf((char *)&ptr,0x106,"%.*f",(double)(uint)v / dVar5,(ulong)spec & 0xffffffff);
  }
  else {
    if (fmt->type == 100) {
      local_1e8 = "%d";
    }
    else {
      if (fmt->type == 0x75) {
        local_1f0 = "%u";
      }
      else {
        if (fmt->type == 0x58) {
          local_1f8 = "%X";
        }
        else {
          if (fmt->type == 0x78) {
            local_200 = "%x";
          }
          else {
            if (fmt->type == 0x6f) {
              local_208 = "%o";
            }
            else {
              local_208 = "%d";
            }
            local_200 = local_208;
          }
          local_1f8 = local_200;
        }
        local_1f0 = local_1f8;
      }
      local_1e8 = local_1f0;
    }
    snprintf((char *)&ptr,0x106,local_1e8,(ulong)(uint)v);
  }
  numLen = strlen((char *)&ptr);
  totalLen = (long)(int)((uint)(prefix != '\0') + (uint)(valueBuf[0x103] != '\0')) + numLen;
  local_210 = totalLen;
  if (totalLen < fmt->width) {
    local_210 = fmt->width;
  }
  padLen = local_210;
  if (bufLen - 1 < local_210) {
    error("Formatted numeric value too long\n");
    padLen = bufLen - 1;
    if (padLen < totalLen) {
      numLen = numLen - (totalLen - padLen);
      totalLen = padLen;
    }
  }
  bVar2 = false;
  if (((totalLen < bufLen) && (bVar2 = false, padLen < bufLen)) &&
     (bVar2 = false, totalLen <= padLen)) {
    bVar2 = numLen <= totalLen;
  }
  if (bVar2) {
    i_1 = 0;
    if ((fmt->alignLeft & 1U) == 0) {
      if ((fmt->padZero & 1U) == 0) {
        for (local_1b0 = 0; local_1b0 < padLen - totalLen; local_1b0 = local_1b0 + 1) {
          buf[i_1] = ' ';
          i_1 = i_1 + 1;
        }
        if (prefix != '\0') {
          buf[i_1] = prefix;
          i_1 = i_1 + 1;
        }
        if (valueBuf[0x103] != '\0') {
          buf[i_1] = valueBuf[0x103];
          i_1 = i_1 + 1;
        }
      }
      else {
        if (prefix != '\0') {
          *buf = prefix;
        }
        i_1 = (size_t)(prefix != '\0');
        if (valueBuf[0x103] != '\0') {
          buf[i_1] = valueBuf[0x103];
          i_1 = i_1 + 1;
        }
        for (i_3 = 0; i_3 < padLen - totalLen; i_3 = i_3 + 1) {
          buf[i_1] = '0';
          i_1 = i_1 + 1;
        }
      }
      memcpy(buf + i_1,&ptr,numLen);
    }
    else {
      if (prefix != '\0') {
        *buf = prefix;
      }
      i_1 = (size_t)(prefix != '\0');
      if (valueBuf[0x103] != '\0') {
        buf[i_1] = valueBuf[0x103];
        i_1 = i_1 + 1;
      }
      memcpy(buf + i_1,&ptr,numLen);
      for (i_2 = i_1 + numLen; i_2 < padLen; i_2 = i_2 + 1) {
        buf[i_2] = ' ';
      }
    }
    buf[padLen] = '\0';
    return;
  }
  __assert_fail("numLen < bufLen && totalLen < bufLen && numLen <= totalLen && len <= numLen",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/format.cpp"
                ,0x101,"void fmt_PrintNumber(char *, size_t, const struct FormatSpec *, uint32_t)");
}

Assistant:

void fmt_PrintNumber(char *buf, size_t bufLen, struct FormatSpec const *fmt, uint32_t value)
{
	if (fmt->type != 'X' && fmt->type != 'x' && fmt->type != 'b' && fmt->type != 'o'
	    && fmt->prefix)
		error("Formatting type '%c' with prefix flag '#'\n", fmt->type);
	if (fmt->type != 'f' && fmt->hasFrac)
		error("Formatting type '%c' with fractional width\n", fmt->type);
	if (fmt->type == 's')
		error("Formatting number as type 's'\n");

	char sign = fmt->sign; // 0 or ' ' or '+'

	if (fmt->type == 'd' || fmt->type == 'f') {
		int32_t v = value;

		if (v < 0 && v != INT32_MIN) {
			sign = '-';
			value = -v;
		}
	}

	char prefix = !fmt->prefix ? 0
		: fmt->type == 'X' ? '$'
		: fmt->type == 'x' ? '$'
		: fmt->type == 'b' ? '%'
		: fmt->type == 'o' ? '&'
		: 0;

	char valueBuf[262]; // Max 5 digits + decimal + 255 fraction digits + terminator

	if (fmt->type == 'b') {
		// Special case for binary
		char *ptr = valueBuf;

		do {
			*ptr++ = (value & 1) + '0';
			value >>= 1;
		} while (value);

		*ptr = '\0';

		// Reverse the digits
		size_t valueLen = ptr - valueBuf;

		for (size_t i = 0, j = valueLen - 1; i < j; i++, j--) {
			char c = valueBuf[i];

			valueBuf[i] = valueBuf[j];
			valueBuf[j] = c;
		}
	} else if (fmt->type == 'f') {
		// Special case for fixed-point

		// Default fractional width (C's is 6 for "%f"; here 5 is enough for Q16.16)
		size_t fracWidth = fmt->hasFrac ? fmt->fracWidth : 5;

		if (fracWidth > 255) {
			error("Fractional width %zu too long, limiting to 255\n",
			      fracWidth);
			fracWidth = 255;
		}

		snprintf(valueBuf, sizeof(valueBuf), "%.*f", (int)fracWidth,
			 value / fix_PrecisionFactor());
	} else {
		char const *spec = fmt->type == 'd' ? "%" PRId32
				 : fmt->type == 'u' ? "%" PRIu32
				 : fmt->type == 'X' ? "%" PRIX32
				 : fmt->type == 'x' ? "%" PRIx32
				 : fmt->type == 'o' ? "%" PRIo32
				 : "%" PRId32;

		snprintf(valueBuf, sizeof(valueBuf), spec, value);
	}

	size_t len = strlen(valueBuf);
	size_t numLen = (sign != 0) + (prefix != 0) + len;
	size_t totalLen = fmt->width > numLen ? fmt->width : numLen;

	if (totalLen > bufLen - 1) { // bufLen includes terminator
		error("Formatted numeric value too long\n");
		totalLen = bufLen - 1;
		if (numLen > totalLen) {
			len -= numLen - totalLen;
			numLen = totalLen;
		}
	}
	assert(numLen < bufLen && totalLen < bufLen && numLen <= totalLen && len <= numLen);

	size_t padLen = totalLen - numLen;
	size_t pos = 0;

	if (fmt->alignLeft) {
		if (sign)
			buf[pos++] = sign;
		if (prefix)
			buf[pos++] = prefix;
		memcpy(buf + pos, valueBuf, len);
		for (size_t i = pos + len; i < totalLen; i++)
			buf[i] = ' ';
	} else {
		if (fmt->padZero) {
			// sign, then prefix, then zero padding
			if (sign)
				buf[pos++] = sign;
			if (prefix)
				buf[pos++] = prefix;
			for (size_t i = 0; i < padLen; i++)
				buf[pos++] = '0';
		} else {
			// space padding, then sign, then prefix
			for (size_t i = 0; i < padLen; i++)
				buf[pos++] = ' ';
			if (sign)
				buf[pos++] = sign;
			if (prefix)
				buf[pos++] = prefix;
		}
		memcpy(buf + pos, valueBuf, len);
	}

	buf[totalLen] = '\0';
}